

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O3

Type<14> * __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::section::Type<14>_>::section
          (Base<njoy::ENDFtk::file::Type<14>,_njoy::ENDFtk::section::Type<14>_> *this,int mt)

{
  mapped_type *pmVar1;
  key_type local_14;
  
  pmVar1 = std::
           map<int,_njoy::ENDFtk::section::Type<14>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<14>_>_>_>
           ::at(&this->sections_,&local_14);
  return pmVar1;
}

Assistant:

const Section& section( int mt ) const {

      try {

        return this->sections_.at( mt );
      }
      catch( std::out_of_range& o ) {

        Log::error( "Requested section number (MT) does not"
                    " correspond to a stored section" );
        Log::info( "Requested section number: {}", mt );
        Log::info( "File queried: ", this->MF() );
        throw o;
      }
    }